

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SpecType ty)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "SpecTypeAttribute";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "SpecTypeConnection";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "SpecTypeExpression";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "SpecTypeMapper";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "SpecTypeMapperArg";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "SpecTypePrim";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "SpecTypePseudoRoot";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "SpecTypeRelationship";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "SpecTypeRelationshipTarget";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "SpecTypeVariant";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "SpecTypeVariantSet";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "SpecTypeInvalid";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::SpecType ty) {
  if (SpecType::Attribute == ty) {
    return "SpecTypeAttribute";
  } else if (SpecType::Connection == ty) {
    return "SpecTypeConnection";
  } else if (SpecType::Expression == ty) {
    return "SpecTypeExpression";
  } else if (SpecType::Mapper == ty) {
    return "SpecTypeMapper";
  } else if (SpecType::MapperArg == ty) {
    return "SpecTypeMapperArg";
  } else if (SpecType::Prim == ty) {
    return "SpecTypePrim";
  } else if (SpecType::PseudoRoot == ty) {
    return "SpecTypePseudoRoot";
  } else if (SpecType::Relationship == ty) {
    return "SpecTypeRelationship";
  } else if (SpecType::RelationshipTarget == ty) {
    return "SpecTypeRelationshipTarget";
  } else if (SpecType::Variant == ty) {
    return "SpecTypeVariant";
  } else if (SpecType::VariantSet == ty) {
    return "SpecTypeVariantSet";
  }
  return "SpecTypeInvalid";
}